

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O3

void blake2b_compress(blake2b_state *S,void *block,uint64_t f0)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  
  lVar1 = *block;
  lVar2 = *(long *)((long)block + 0x10);
  uVar21 = S->h[1];
  uVar3 = S->h[4];
  uVar4 = S->h[5];
  uVar24 = lVar1 + S->h[0] + uVar3;
  uVar25 = S->t[0] ^ uVar24 ^ 0x510e527fade682d1;
  uVar26 = uVar25 << 0x20 | uVar25 >> 0x20;
  uVar36 = uVar26 + 0x6a09e667f3bcc908;
  uVar25 = uVar21 + lVar2 + uVar4;
  uVar39 = S->t[1] ^ uVar25 ^ 0x9b05688c2b3e6c1f;
  uVar37 = uVar36 ^ uVar3;
  uVar37 = uVar37 << 0x28 | uVar37 >> 0x18;
  lVar5 = *(long *)((long)block + 8);
  uVar34 = uVar24 + lVar5 + uVar37;
  uVar26 = uVar26 ^ uVar34;
  uVar27 = uVar26 << 0x30 | uVar26 >> 0x10;
  uVar36 = uVar36 + uVar27;
  uVar37 = uVar37 ^ uVar36;
  uVar38 = uVar37 << 1 | (ulong)((long)uVar37 < 0);
  uVar26 = uVar39 << 0x20 | uVar39 >> 0x20;
  uVar19 = uVar26 + 0xbb67ae8584caa73b;
  uVar24 = uVar19 ^ uVar4;
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  lVar6 = *(long *)((long)block + 0x18);
  uVar20 = uVar25 + lVar6 + uVar24;
  uVar26 = uVar26 ^ uVar20;
  uVar40 = uVar26 << 0x30 | uVar26 >> 0x10;
  uVar19 = uVar19 + uVar40;
  uVar24 = uVar24 ^ uVar19;
  uVar35 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  lVar7 = *(long *)((long)block + 0x20);
  uVar25 = S->h[2];
  uVar24 = S->h[6];
  uVar26 = uVar25 + lVar7 + uVar24;
  uVar37 = f0 ^ 0x1f83d9abfb41bd6b ^ uVar26;
  uVar32 = uVar37 << 0x20 | uVar37 >> 0x20;
  uVar39 = uVar32 + 0x3c6ef372fe94f82b;
  uVar37 = uVar39 ^ uVar24;
  uVar37 = uVar37 << 0x28 | uVar37 >> 0x18;
  lVar8 = *(long *)((long)block + 0x28);
  uVar28 = uVar26 + lVar8 + uVar37;
  uVar32 = uVar32 ^ uVar28;
  uVar33 = uVar32 << 0x30 | uVar32 >> 0x10;
  uVar39 = uVar39 + uVar33;
  uVar37 = uVar37 ^ uVar39;
  uVar29 = uVar37 << 1 | (ulong)((long)uVar37 < 0);
  lVar9 = *(long *)((long)block + 0x30);
  uVar26 = S->h[3];
  uVar37 = S->h[7];
  uVar30 = uVar26 + lVar9 + uVar37;
  uVar32 = uVar30 ^ 0x5be0cd19137e2179;
  uVar23 = uVar32 << 0x20 | uVar32 >> 0x20;
  uVar32 = uVar23 + 0xa54ff53a5f1d36f1;
  uVar22 = uVar32 ^ uVar37;
  uVar22 = uVar22 << 0x28 | uVar22 >> 0x18;
  lVar10 = *(long *)((long)block + 0x38);
  uVar31 = uVar30 + lVar10 + uVar22;
  uVar23 = uVar23 ^ uVar31;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar32 = uVar32 + uVar23;
  uVar22 = uVar22 ^ uVar32;
  uVar30 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  lVar11 = *(long *)((long)block + 0x40);
  uVar22 = uVar34 + lVar11 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar39 = uVar39 + uVar23;
  uVar35 = uVar35 ^ uVar39;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  lVar12 = *(long *)((long)block + 0x48);
  uVar22 = uVar22 + lVar12 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar34 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar39 = uVar39 + uVar34;
  uVar35 = uVar35 ^ uVar39;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  lVar13 = *(long *)((long)block + 0x50);
  uVar20 = uVar20 + lVar13 + uVar29;
  uVar27 = uVar27 ^ uVar20;
  uVar23 = uVar27 << 0x20 | uVar27 >> 0x20;
  uVar32 = uVar32 + uVar23;
  uVar29 = uVar29 ^ uVar32;
  uVar27 = uVar29 << 0x28 | uVar29 >> 0x18;
  lVar14 = *(long *)((long)block + 0x58);
  uVar20 = uVar20 + lVar14 + uVar27;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar32 = uVar32 + uVar23;
  uVar27 = uVar27 ^ uVar32;
  uVar29 = uVar27 << 1 | (ulong)((long)uVar27 < 0);
  lVar15 = *(long *)((long)block + 0x60);
  uVar27 = uVar28 + lVar15 + uVar30;
  uVar40 = uVar40 ^ uVar27;
  uVar28 = uVar40 << 0x20 | uVar40 >> 0x20;
  uVar36 = uVar36 + uVar28;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  lVar16 = *(long *)((long)block + 0x68);
  uVar27 = uVar27 + lVar16 + uVar30;
  uVar28 = uVar28 ^ uVar27;
  uVar40 = uVar28 << 0x30 | uVar28 >> 0x10;
  uVar36 = uVar36 + uVar40;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  lVar17 = *(long *)((long)block + 0x70);
  uVar28 = uVar31 + lVar17 + uVar38;
  uVar33 = uVar33 ^ uVar28;
  uVar33 = uVar33 << 0x20 | uVar33 >> 0x20;
  uVar19 = uVar19 + uVar33;
  uVar38 = uVar38 ^ uVar19;
  uVar38 = uVar38 << 0x28 | uVar38 >> 0x18;
  lVar18 = *(long *)((long)block + 0x78);
  uVar31 = uVar28 + lVar18 + uVar38;
  uVar33 = uVar33 ^ uVar31;
  uVar28 = uVar33 << 0x30 | uVar33 >> 0x10;
  uVar19 = uVar19 + uVar28;
  uVar38 = uVar38 ^ uVar19;
  uVar33 = uVar38 << 1 | (ulong)((long)uVar38 < 0);
  uVar22 = uVar22 + lVar17 + uVar33;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar36 = uVar36 + uVar23;
  uVar33 = uVar33 ^ uVar36;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar22 = uVar22 + lVar13 + uVar33;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar33 = uVar33 ^ uVar36;
  uVar38 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar20 = uVar20 + lVar7 + uVar35;
  uVar40 = uVar40 ^ uVar20;
  uVar40 = uVar40 << 0x20 | uVar40 >> 0x20;
  uVar19 = uVar19 + uVar40;
  uVar35 = uVar35 ^ uVar19;
  uVar33 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar20 = uVar20 + lVar11 + uVar33;
  uVar40 = uVar40 ^ uVar20;
  uVar40 = uVar40 << 0x30 | uVar40 >> 0x10;
  uVar19 = uVar19 + uVar40;
  uVar33 = uVar33 ^ uVar19;
  uVar35 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar27 = uVar27 + lVar12 + uVar29;
  uVar28 = uVar28 ^ uVar27;
  uVar33 = uVar28 << 0x20 | uVar28 >> 0x20;
  uVar39 = uVar39 + uVar33;
  uVar29 = uVar29 ^ uVar39;
  uVar28 = uVar29 << 0x28 | uVar29 >> 0x18;
  uVar27 = uVar27 + lVar18 + uVar28;
  uVar33 = uVar33 ^ uVar27;
  uVar33 = uVar33 << 0x30 | uVar33 >> 0x10;
  uVar39 = uVar39 + uVar33;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar29 = uVar31 + lVar16 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar29 = uVar29 + lVar9 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar22 = uVar22 + lVar5 + uVar35;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar39 = uVar39 + uVar34;
  uVar35 = uVar35 ^ uVar39;
  uVar31 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar22 = uVar22 + lVar15 + uVar31;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar39 = uVar39 + uVar34;
  uVar31 = uVar31 ^ uVar39;
  uVar35 = uVar31 << 1 | (ulong)((long)uVar31 < 0);
  uVar20 = uVar20 + lVar1 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar20 = uVar20 + lVar2 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar27 = uVar27 + lVar14 + uVar30;
  uVar40 = uVar40 ^ uVar27;
  uVar31 = uVar40 << 0x20 | uVar40 >> 0x20;
  uVar36 = uVar36 + uVar31;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar27 = uVar27 + lVar10 + uVar30;
  uVar31 = uVar31 ^ uVar27;
  uVar40 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar36 = uVar36 + uVar40;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar29 = uVar29 + lVar8 + uVar38;
  uVar33 = uVar33 ^ uVar29;
  uVar31 = uVar33 << 0x20 | uVar33 >> 0x20;
  uVar19 = uVar19 + uVar31;
  uVar38 = uVar38 ^ uVar19;
  uVar33 = uVar38 << 0x28 | uVar38 >> 0x18;
  uVar29 = uVar29 + lVar6 + uVar33;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar19 = uVar19 + uVar31;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar22 = uVar22 + lVar14 + uVar33;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar36 = uVar36 + uVar23;
  uVar33 = uVar33 ^ uVar36;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar22 = uVar22 + lVar11 + uVar33;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar33 = uVar33 ^ uVar36;
  uVar38 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar20 = uVar20 + lVar15 + uVar35;
  uVar40 = uVar40 ^ uVar20;
  uVar40 = uVar40 << 0x20 | uVar40 >> 0x20;
  uVar19 = uVar19 + uVar40;
  uVar35 = uVar35 ^ uVar19;
  uVar33 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar20 = uVar20 + lVar1 + uVar33;
  uVar40 = uVar40 ^ uVar20;
  uVar35 = uVar40 << 0x30 | uVar40 >> 0x10;
  uVar19 = uVar19 + uVar35;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar27 = uVar27 + lVar8 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar27 = uVar27 + lVar2 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar29 = uVar29 + lVar18 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar29 = uVar29 + lVar16 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar22 = uVar22 + lVar13 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar22 = uVar22 + lVar17 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar20 = uVar20 + lVar6 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar20 = uVar20 + lVar9 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar27 = uVar27 + lVar10 + uVar30;
  uVar35 = uVar35 ^ uVar27;
  uVar35 = uVar35 << 0x20 | uVar35 >> 0x20;
  uVar36 = uVar36 + uVar35;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar27 = uVar27 + lVar5 + uVar30;
  uVar35 = uVar35 ^ uVar27;
  uVar40 = uVar35 << 0x30 | uVar35 >> 0x10;
  uVar36 = uVar36 + uVar40;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar29 = uVar29 + lVar12 + uVar38;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar19 = uVar19 + uVar31;
  uVar38 = uVar38 ^ uVar19;
  uVar35 = uVar38 << 0x28 | uVar38 >> 0x18;
  uVar29 = uVar29 + lVar7 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar22 = uVar22 + lVar10 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar22 = uVar22 + lVar12 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar20 = uVar20 + lVar6 + uVar33;
  uVar40 = uVar40 ^ uVar20;
  uVar38 = uVar40 << 0x20 | uVar40 >> 0x20;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar20 = uVar20 + lVar5 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar27 = uVar27 + lVar16 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar27 = uVar27 + lVar15 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar29 = uVar29 + lVar14 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar29 = uVar29 + lVar17 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar22 = uVar22 + lVar2 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar22 = uVar22 + lVar9 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar20 = uVar20 + lVar8 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar20 = uVar20 + lVar13 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar27 = uVar27 + lVar7 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar27 = uVar27 + lVar1 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar29 = uVar29 + lVar18 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar29 = uVar29 + lVar11 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar22 = uVar22 + lVar12 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar22 = uVar22 + lVar1 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar20 = uVar20 + lVar8 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar20 = uVar20 + lVar10 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar27 = uVar27 + lVar2 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar27 = uVar27 + lVar7 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar29 = uVar29 + lVar13 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar29 = uVar29 + lVar18 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar22 = uVar22 + lVar17 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar22 = uVar22 + lVar5 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar20 = uVar20 + lVar14 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar20 = uVar20 + lVar15 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar27 = uVar27 + lVar9 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar27 = uVar27 + lVar11 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar29 = uVar29 + lVar6 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar29 = uVar29 + lVar16 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar22 = uVar22 + lVar2 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar22 = uVar22 + lVar15 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar20 = uVar20 + lVar9 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar20 = uVar20 + lVar13 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar27 = uVar27 + lVar1 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar27 = uVar27 + lVar14 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar29 = uVar29 + lVar11 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar29 = uVar29 + lVar6 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar22 = uVar22 + lVar7 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar22 = uVar22 + lVar16 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar20 = uVar20 + lVar10 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar20 = uVar20 + lVar8 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar27 = uVar27 + lVar18 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar27 = uVar27 + lVar17 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar29 = uVar29 + lVar5 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar29 = uVar29 + lVar12 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar22 = uVar22 + lVar15 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar22 = uVar22 + lVar8 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar20 = uVar20 + lVar5 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar20 = uVar20 + lVar18 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar27 = uVar27 + lVar17 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar27 = uVar27 + lVar16 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar29 = uVar29 + lVar7 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar29 = uVar29 + lVar13 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar22 = uVar22 + lVar1 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar22 = uVar22 + lVar10 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar20 = uVar20 + lVar9 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar20 = uVar20 + lVar6 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar27 = uVar27 + lVar12 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar27 = uVar27 + lVar2 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar29 = uVar29 + lVar11 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar29 = uVar29 + lVar14 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar22 = uVar22 + lVar16 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar22 = uVar22 + lVar14 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar20 = uVar20 + lVar10 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar20 = uVar20 + lVar17 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar27 = uVar27 + lVar15 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar27 = uVar27 + lVar5 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar29 = uVar29 + lVar6 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar29 = uVar29 + lVar12 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar22 = uVar22 + lVar8 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar22 = uVar22 + lVar1 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar20 = uVar20 + lVar18 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar20 = uVar20 + lVar7 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar27 = uVar27 + lVar11 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar27 = uVar27 + lVar9 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar29 = uVar29 + lVar2 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar29 = uVar29 + lVar13 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar22 = uVar22 + lVar9 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar22 = uVar22 + lVar18 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar20 = uVar20 + lVar17 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar20 = uVar20 + lVar12 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar27 = uVar27 + lVar14 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar27 = uVar27 + lVar6 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar29 = uVar29 + lVar1 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar29 = uVar29 + lVar11 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar22 = uVar22 + lVar15 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar22 = uVar22 + lVar2 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar20 = uVar20 + lVar16 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar20 = uVar20 + lVar10 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar27 = uVar27 + lVar5 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar27 = uVar27 + lVar7 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar29 = uVar29 + lVar13 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar29 = uVar29 + lVar8 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar22 = uVar22 + lVar13 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar22 = uVar22 + lVar2 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar20 = uVar20 + lVar11 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar20 = uVar20 + lVar7 + uVar33;
  uVar38 = uVar38 ^ uVar20;
  uVar38 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar19 = uVar19 + uVar38;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar27 = uVar27 + lVar10 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar27 = uVar27 + lVar9 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar29 = uVar29 + lVar5 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar29 = uVar29 + lVar8 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar22 = uVar22 + lVar18 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar22 = uVar22 + lVar14 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar39 = uVar39 + uVar34;
  uVar33 = uVar33 ^ uVar39;
  uVar33 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar20 = uVar20 + lVar12 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar20 = uVar20 + lVar17 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar27 = uVar27 + lVar6 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar38 = uVar38 << 0x20 | uVar38 >> 0x20;
  uVar36 = uVar36 + uVar38;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar27 = uVar27 + lVar15 + uVar30;
  uVar38 = uVar38 ^ uVar27;
  uVar40 = uVar38 << 0x30 | uVar38 >> 0x10;
  uVar36 = uVar36 + uVar40;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar29 = uVar29 + lVar16 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar29 = uVar29 + lVar1 + uVar35;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar19 = uVar19 + uVar31;
  uVar35 = uVar35 ^ uVar19;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar22 = uVar22 + lVar1 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar22 = uVar22 + lVar5 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar35 = uVar35 ^ uVar36;
  uVar38 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar20 = uVar20 + lVar2 + uVar33;
  uVar40 = uVar40 ^ uVar20;
  uVar35 = uVar40 << 0x20 | uVar40 >> 0x20;
  uVar19 = uVar19 + uVar35;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 << 0x28 | uVar33 >> 0x18;
  uVar20 = uVar20 + lVar6 + uVar33;
  uVar35 = uVar35 ^ uVar20;
  uVar40 = uVar35 << 0x30 | uVar35 >> 0x10;
  uVar19 = uVar19 + uVar40;
  uVar33 = uVar33 ^ uVar19;
  uVar35 = uVar33 << 1 | (ulong)((long)uVar33 < 0);
  uVar27 = uVar27 + lVar7 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar27 = uVar27 + lVar8 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar33 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar39 = uVar39 + uVar33;
  uVar29 = uVar29 + lVar9 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar28 = uVar28 ^ uVar39;
  uVar29 = uVar29 + lVar10 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar32 = uVar32 + uVar34;
  uVar22 = uVar22 + lVar11 + uVar35;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar39 = uVar39 + uVar34;
  uVar35 = uVar35 ^ uVar39;
  uVar35 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar31 = uVar22 + lVar12 + uVar35;
  uVar34 = uVar34 ^ uVar31;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar22 = uVar20 + lVar13 + uVar28;
  uVar23 = uVar23 ^ uVar22;
  uVar20 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar32 = uVar32 + uVar20;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar22 = uVar22 + lVar14 + uVar28;
  uVar20 = uVar20 ^ uVar22;
  uVar23 = uVar20 << 0x30 | uVar20 >> 0x10;
  uVar20 = uVar29 + lVar17 + uVar38;
  uVar33 = uVar33 ^ uVar20;
  uVar33 = uVar33 << 0x20 | uVar33 >> 0x20;
  uVar19 = uVar19 + uVar33;
  uVar38 = uVar38 ^ uVar19;
  uVar38 = uVar38 << 0x28 | uVar38 >> 0x18;
  uVar32 = uVar32 + uVar23;
  uVar29 = uVar20 + lVar18 + uVar38;
  uVar33 = uVar33 ^ uVar29;
  uVar33 = uVar33 << 0x30 | uVar33 >> 0x10;
  uVar19 = uVar19 + uVar33;
  uVar38 = uVar38 ^ uVar19;
  uVar38 = uVar38 << 1 | (ulong)((long)uVar38 < 0);
  uVar31 = uVar31 + lVar17 + uVar38;
  uVar23 = uVar23 ^ uVar31;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar39 = uVar39 + uVar34;
  uVar35 = uVar35 ^ uVar39;
  uVar35 = uVar35 << 1 | (ulong)((long)uVar35 < 0);
  uVar20 = uVar27 + lVar15 + uVar30;
  uVar40 = uVar40 ^ uVar20;
  uVar40 = uVar40 << 0x20 | uVar40 >> 0x20;
  uVar36 = uVar36 + uVar40;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar27 = uVar20 + lVar16 + uVar30;
  uVar40 = uVar40 ^ uVar27;
  uVar40 = uVar40 << 0x30 | uVar40 >> 0x10;
  uVar36 = uVar36 + uVar40;
  uVar20 = uVar22 + lVar7 + uVar35;
  uVar40 = uVar40 ^ uVar20;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar27 = uVar27 + lVar12 + uVar28;
  uVar33 = uVar33 ^ uVar27;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar29 = uVar29 + lVar16 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar36 = uVar36 + uVar23;
  uVar38 = uVar38 ^ uVar36;
  uVar38 = uVar38 << 0x28 | uVar38 >> 0x18;
  uVar22 = uVar31 + lVar13 + uVar38;
  uVar23 = uVar23 ^ uVar22;
  uVar40 = uVar40 << 0x20 | uVar40 >> 0x20;
  uVar19 = uVar19 + uVar40;
  uVar35 = uVar35 ^ uVar19;
  uVar31 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar20 = uVar20 + lVar11 + uVar31;
  uVar40 = uVar40 ^ uVar20;
  uVar40 = uVar40 << 0x30 | uVar40 >> 0x10;
  uVar19 = uVar19 + uVar40;
  uVar31 = uVar31 ^ uVar19;
  uVar35 = uVar31 << 1 | (ulong)((long)uVar31 < 0);
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar32 = uVar32 + uVar34;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar29 = uVar29 + lVar9 + uVar30;
  uVar34 = uVar34 ^ uVar29;
  uVar34 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar32 = uVar32 + uVar34;
  uVar22 = uVar22 + lVar5 + uVar35;
  uVar34 = uVar34 ^ uVar22;
  uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar36 = uVar36 + uVar23;
  uVar31 = uVar33 << 0x20 | uVar33 >> 0x20;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  uVar27 = uVar27 + lVar18 + uVar28;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 << 0x30 | uVar31 >> 0x10;
  uVar39 = uVar39 + uVar31;
  uVar28 = uVar28 ^ uVar39;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar20 = uVar20 + lVar1 + uVar28;
  uVar23 = uVar23 ^ uVar20;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar27 = uVar27 + lVar14 + uVar30;
  uVar40 = uVar40 ^ uVar27;
  uVar38 = uVar38 ^ uVar36;
  uVar38 = uVar38 << 1 | (ulong)((long)uVar38 < 0);
  uVar29 = uVar29 + lVar8 + uVar38;
  uVar31 = uVar31 ^ uVar29;
  uVar33 = uVar40 << 0x20 | uVar40 >> 0x20;
  uVar36 = uVar36 + uVar33;
  uVar30 = uVar30 ^ uVar36;
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  uVar27 = uVar27 + lVar10 + uVar30;
  uVar33 = uVar33 ^ uVar27;
  uVar40 = uVar33 << 0x30 | uVar33 >> 0x10;
  uVar36 = uVar36 + uVar40;
  uVar30 = uVar30 ^ uVar36;
  uVar34 = uVar34 << 0x20 | uVar34 >> 0x20;
  uVar39 = uVar39 + uVar34;
  uVar35 = uVar35 ^ uVar39;
  uVar33 = uVar35 << 0x28 | uVar35 >> 0x18;
  uVar22 = uVar22 + lVar15 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
  uVar32 = uVar32 + uVar23;
  uVar28 = uVar28 ^ uVar32;
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  S->h[0] = uVar36 ^ S->h[0] ^ uVar22;
  uVar36 = uVar20 + lVar2 + uVar28;
  uVar23 = uVar23 ^ uVar36;
  uVar20 = uVar31 << 0x20 | uVar31 >> 0x20;
  uVar19 = uVar19 + uVar20;
  uVar38 = uVar38 ^ uVar19;
  uVar31 = uVar38 << 0x28 | uVar38 >> 0x18;
  uVar22 = uVar29 + lVar6 + uVar31;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 << 0x30 | uVar20 >> 0x10;
  uVar19 = uVar19 + uVar20;
  uVar31 = uVar31 ^ uVar19;
  S->h[1] = uVar36 ^ uVar21 ^ uVar19;
  uVar36 = uVar34 << 0x30 | uVar34 >> 0x10;
  uVar39 = uVar39 + uVar36;
  uVar33 = uVar33 ^ uVar39;
  S->h[2] = uVar27 ^ uVar25 ^ uVar39;
  uVar21 = uVar23 << 0x30 | uVar23 >> 0x10;
  uVar32 = uVar32 + uVar21;
  uVar28 = uVar28 ^ uVar32;
  S->h[3] = uVar32 ^ uVar26 ^ uVar22;
  S->h[4] = uVar21 ^ uVar3 ^ (uVar31 << 1 | (ulong)((long)uVar31 < 0));
  S->h[5] = uVar40 ^ uVar4 ^ (uVar33 << 1 | (ulong)((long)uVar33 < 0));
  S->h[6] = (uVar28 << 1 | (ulong)((long)uVar28 < 0)) ^ uVar24 ^ uVar20;
  S->h[7] = (uVar30 << 1 | (ulong)((long)uVar30 < 0)) ^ uVar37 ^ uVar36;
  return;
}

Assistant:

void blake2b_compress(blake2b_state *S, const void *block, uint64_t f0)
{
    uint64_t m[16];
    uint64_t v[16];

    m[ 0] = load64((const uint64_t *)block +  0);
    m[ 1] = load64((const uint64_t *)block +  1);
    m[ 2] = load64((const uint64_t *)block +  2);
    m[ 3] = load64((const uint64_t *)block +  3);
    m[ 4] = load64((const uint64_t *)block +  4);
    m[ 5] = load64((const uint64_t *)block +  5);
    m[ 6] = load64((const uint64_t *)block +  6);
    m[ 7] = load64((const uint64_t *)block +  7);
    m[ 8] = load64((const uint64_t *)block +  8);
    m[ 9] = load64((const uint64_t *)block +  9);
    m[10] = load64((const uint64_t *)block + 10);
    m[11] = load64((const uint64_t *)block + 11);
    m[12] = load64((const uint64_t *)block + 12);
    m[13] = load64((const uint64_t *)block + 13);
    m[14] = load64((const uint64_t *)block + 14);
    m[15] = load64((const uint64_t *)block + 15);

    v[ 0] = S->h[0];
    v[ 1] = S->h[1];
    v[ 2] = S->h[2];
    v[ 3] = S->h[3];
    v[ 4] = S->h[4];
    v[ 5] = S->h[5];
    v[ 6] = S->h[6];
    v[ 7] = S->h[7];
    v[ 8] = blake2b_IV[0];
    v[ 9] = blake2b_IV[1];
    v[10] = blake2b_IV[2];
    v[11] = blake2b_IV[3];
    v[12] = blake2b_IV[4] ^ S->t[0];
    v[13] = blake2b_IV[5] ^ S->t[1];
    v[14] = blake2b_IV[6] ^ f0;
    v[15] = blake2b_IV[7];

    ROUND(m, v, 0);
    ROUND(m, v, 1);
    ROUND(m, v, 2);
    ROUND(m, v, 3);
    ROUND(m, v, 4);
    ROUND(m, v, 5);
    ROUND(m, v, 6);
    ROUND(m, v, 7);
    ROUND(m, v, 8);
    ROUND(m, v, 9);
    ROUND(m, v, 10);
    ROUND(m, v, 11);

    S->h[0] ^= v[0] ^ v[ 8];
    S->h[1] ^= v[1] ^ v[ 9];
    S->h[2] ^= v[2] ^ v[10];
    S->h[3] ^= v[3] ^ v[11];
    S->h[4] ^= v[4] ^ v[12];
    S->h[5] ^= v[5] ^ v[13];
    S->h[6] ^= v[6] ^ v[14];
    S->h[7] ^= v[7] ^ v[15];
}